

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_a.c
# Opt level: O3

void test_option_a(void)

{
  wchar_t wVar1;
  size_t in_RAX;
  char *pcVar2;
  size_t s;
  
  s = in_RAX;
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'#',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = systemf("%s -acf test1.tar.Z f 2>test1.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'\'',0,"0",(long)wVar1,
                      "systemf(\"%s -acf test1.tar.Z f 2>test1.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
             ,L'(',"test1.err");
  pcVar2 = slurpfile(&s,"test1.tar.Z");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                   ,L'+',(uint)(2 < s),"s > 2",(void *)0x0);
  failure("The archive should be compressed");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'-',pcVar2,"p",anon_var_dwarf_db84,"\"\\x1f\\x9d\"",2,"2",(void *)0x0);
  wVar1 = systemf("%s -acf test2.taZ f 2>test2.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'1',0,"0",(long)wVar1,
                      "systemf(\"%s -acf test2.taZ f 2>test2.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
             ,L'2',"test2.err");
  pcVar2 = slurpfile(&s,"test2.taZ");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                   ,L'5',(uint)(2 < s),"s > 2",(void *)0x0);
  failure("The archive should be compressed");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'7',pcVar2,"p",anon_var_dwarf_db84,"\"\\x1f\\x9d\"",2,"2",(void *)0x0);
  wVar1 = systemf("%s -acf test3.tar.Z.uu f 2>test3.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L';',0,"0",(long)wVar1,
                      "systemf(\"%s -acf test3.tar.Z.uu f 2>test3.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
             ,L'<',"test3.err");
  pcVar2 = slurpfile(&s,"test3.tar.Z.uu");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                   ,L'?',(uint)(0xc < s),"s > 12",(void *)0x0);
  failure("The archive should be uuencoded");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'A',pcVar2,"p","begin 644 -\n","\"begin 644 -\\n\"",0xc,"12",(void *)0x0);
  wVar1 = systemf("%s -acf test4.zip f 2>test4.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'E',0,"0",(long)wVar1,
                      "systemf(\"%s -acf test4.zip f 2>test4.err\", testprog)",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
             ,L'F',"test4.err");
  pcVar2 = slurpfile(&s,"test4.zip");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                   ,L'I',(uint)(4 < s),"s > 4",(void *)0x0);
  failure("The archive should be zipped");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'K',pcVar2,"p","PK\x03\x04","\"\\x50\\x4b\\x03\\x04\"",4,"4",(void *)0x0);
  wVar1 = systemf("%s -acf test5.tar.Z --uuencode f 2>test5.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'P',0,"0",(long)wVar1,
                      "systemf(\"%s -acf test5.tar.Z --uuencode f 2>test5.err\", testprog)",
                      (void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
             ,L'Q',"test5.err");
  pcVar2 = slurpfile(&s,"test5.tar.Z");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                   ,L'T',(uint)(2 < s),"s > 2",(void *)0x0);
  failure("The archive should be compressed, ignoring --uuencode option");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'V',pcVar2,"p",anon_var_dwarf_db84,"\"\\x1f\\x9d\"",2,"2",(void *)0x0);
  wVar1 = systemf("%s -acf test6.xxx --uuencode f 2>test6.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'\\',0,"0",(long)wVar1,
                      "systemf(\"%s -acf test6.xxx --uuencode f 2>test6.err\", testprog)",
                      (void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
             ,L']',"test6.err");
  pcVar2 = slurpfile(&s,"test6.xxx");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                   ,L'`',(uint)(0xc < s),"s > 12",(void *)0x0);
  failure("The archive should be uuencoded");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'b',pcVar2,"p","begin 644 -\n","\"begin 644 -\\n\"",0xc,"12",(void *)0x0);
  wVar1 = systemf("%s --auto-compress -cf test7.tar.Z f 2>test7.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'g',0,"0",(long)wVar1,
                      "systemf(\"%s --auto-compress -cf test7.tar.Z f 2>test7.err\", testprog)",
                      (void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
             ,L'h',"test7.err");
  pcVar2 = slurpfile(&s,"test7.tar.Z");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                   ,L'k',(uint)(2 < s),"s > 2",(void *)0x0);
  failure("The archive should be compressed");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_a.c"
                      ,L'm',pcVar2,"p",anon_var_dwarf_db84,"\"\\x1f\\x9d\"",2,"2",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_option_a)
{
	size_t s;
	char *p;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Test1: archive it with .tar.Z suffix. */
	assertEqualInt(0,
	    systemf("%s -acf test1.tar.Z f 2>test1.err", testprog));
	assertEmptyFile("test1.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test1.tar.Z");
	assert(s > 2);
	failure("The archive should be compressed");
	assertEqualMem(p, "\x1f\x9d", 2);

	/* Test2: archive it with .taZ suffix. */
	assertEqualInt(0,
	    systemf("%s -acf test2.taZ f 2>test2.err", testprog));
	assertEmptyFile("test2.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test2.taZ");
	assert(s > 2);
	failure("The archive should be compressed");
	assertEqualMem(p, "\x1f\x9d", 2);

	/* Test3: archive it with .tar.Z.uu suffix. */
	assertEqualInt(0,
	    systemf("%s -acf test3.tar.Z.uu f 2>test3.err", testprog));
	assertEmptyFile("test3.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test3.tar.Z.uu");
	assert(s > 12);
	failure("The archive should be uuencoded");
	assertEqualMem(p, "begin 644 -\n", 12);

	/* Test4: archive it with .zip suffix. */
	assertEqualInt(0,
	    systemf("%s -acf test4.zip f 2>test4.err", testprog));
	assertEmptyFile("test4.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test4.zip");
	assert(s > 4);
	failure("The archive should be zipped");
	assertEqualMem(p, "\x50\x4b\x03\x04", 4);

	/* Test5: archive it with .tar.Z suffix and --uuencode option. */
	assertEqualInt(0,
	    systemf("%s -acf test5.tar.Z --uuencode f 2>test5.err",
		testprog));
	assertEmptyFile("test5.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test5.tar.Z");
	assert(s > 2);
	failure("The archive should be compressed, ignoring --uuencode option");
	assertEqualMem(p, "\x1f\x9d", 2);

	/* Test6: archive it with .xxx suffix(unknown suffix) and
	 * --uuencode option. */
	assertEqualInt(0,
	    systemf("%s -acf test6.xxx --uuencode f 2>test6.err",
		testprog));
	assertEmptyFile("test6.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test6.xxx");
	assert(s > 12);
	failure("The archive should be uuencoded");
	assertEqualMem(p, "begin 644 -\n", 12);

	/* Test7: archive it with .tar.Z suffix using a long-name option. */
	assertEqualInt(0,
	    systemf("%s --auto-compress -cf test7.tar.Z f 2>test7.err",
		testprog));
	assertEmptyFile("test7.err");
	/* Check that the archive file has a compress signature. */
	p = slurpfile(&s, "test7.tar.Z");
	assert(s > 2);
	failure("The archive should be compressed");
	assertEqualMem(p, "\x1f\x9d", 2);
}